

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hostasyn.c
# Opt level: O3

CURLcode Curl_addrinfo_callback(Curl_easy *data,int status,Curl_addrinfo *ai)

{
  undefined1 *puVar1;
  Curl_dns_entry *pCVar2;
  CURLcode CVar3;
  
  (data->state).async.status = status;
  if (status == 0) {
    if (ai != (Curl_addrinfo *)0x0) {
      if (data->share != (Curl_share *)0x0) {
        Curl_share_lock(data,CURL_LOCK_DATA_DNS,CURL_LOCK_ACCESS_SINGLE);
      }
      CVar3 = CURLE_OK;
      pCVar2 = Curl_cache_addr(data,ai,(data->state).async.hostname,0,(data->state).async.port,false
                              );
      if (data->share != (Curl_share *)0x0) {
        Curl_share_unlock(data,CURL_LOCK_DATA_DNS);
      }
      if (pCVar2 != (Curl_dns_entry *)0x0) goto LAB_0012f992;
      Curl_freeaddrinfo(ai);
    }
    pCVar2 = (Curl_dns_entry *)0x0;
    CVar3 = CURLE_OUT_OF_MEMORY;
  }
  else {
    pCVar2 = (Curl_dns_entry *)0x0;
    CVar3 = CURLE_OK;
  }
LAB_0012f992:
  (data->state).async.dns = pCVar2;
  puVar1 = &(data->state).async.field_0x28;
  *puVar1 = *puVar1 | 1;
  return CVar3;
}

Assistant:

CURLcode Curl_addrinfo_callback(struct Curl_easy *data,
                                int status,
                                struct Curl_addrinfo *ai)
{
  struct Curl_dns_entry *dns = NULL;
  CURLcode result = CURLE_OK;

  data->state.async.status = status;

  if(CURL_ASYNC_SUCCESS == status) {
    if(ai) {
      if(data->share)
        Curl_share_lock(data, CURL_LOCK_DATA_DNS, CURL_LOCK_ACCESS_SINGLE);

      dns = Curl_cache_addr(data, ai,
                            data->state.async.hostname, 0,
                            data->state.async.port, FALSE);
      if(data->share)
        Curl_share_unlock(data, CURL_LOCK_DATA_DNS);

      if(!dns) {
        /* failed to store, cleanup and return error */
        Curl_freeaddrinfo(ai);
        result = CURLE_OUT_OF_MEMORY;
      }
    }
    else {
      result = CURLE_OUT_OF_MEMORY;
    }
  }

  data->state.async.dns = dns;

 /* Set async.done TRUE last in this function since it may be used multi-
    threaded and once this is TRUE the other thread may read fields from the
    async struct */
  data->state.async.done = TRUE;

  /* IPv4: The input hostent struct will be freed by ares when we return from
     this function */
  return result;
}